

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

bool __thiscall cmCTestBZR::LoadRevisions(cmCTestBZR *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  cmCTest *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar2;
  int iVar3;
  ostream *this_01;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9c8;
  string local_950 [32];
  ostringstream local_930 [8];
  ostringstream cmCTestLog_msg_1;
  string local_7b8;
  undefined1 local_798 [8];
  OutputLogger err;
  LogParser out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  iterator local_270;
  size_type local_268;
  undefined1 local_260 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_log;
  string bzr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0 [8];
  string revs;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestBZR *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_01 = std::operator<<((ostream *)local_190,
                            "   Gathering version information (one . per revision):\n    ");
  std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBZR.cxx"
               ,0x18a,pcVar4,false);
  std::__cxx11::string::~string((string *)(revs.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::clear
            (&(this->super_cmCTestGlobalVC).Revisions);
  std::__cxx11::string::string(local_1e0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = atoi(pcVar4);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = atoi(pcVar4);
  if (iVar2 <= iVar3) {
    std::operator+(&local_220,&(this->super_cmCTestGlobalVC).OldRevision,"..");
    std::operator+(&local_200,&local_220,&(this->super_cmCTestGlobalVC).NewRevision);
    std::__cxx11::string::operator=(local_1e0,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::string
              ((string *)
               &bzr_log.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
    out.EmailRegex.progsize._3_1_ = 1;
    std::__cxx11::string::string
              ((string *)&local_350,
               (string *)
               &bzr_log.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_330,"log",(allocator<char> *)&out.EmailRegex.field_0x22f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_310,"-v",(allocator<char> *)&out.EmailRegex.field_0x22e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_2f0,"-r",(allocator<char> *)&out.EmailRegex.field_0x22d);
    std::__cxx11::string::string(local_2d0,local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_2b0,"--xml",(allocator<char> *)&out.EmailRegex.field_0x22c);
    std::__cxx11::string::string(local_290,(string *)&this->URL);
    out.EmailRegex.progsize._3_1_ = 0;
    local_270 = &local_350;
    local_268 = 7;
    this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&out.EmailRegex.progsize + 2);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_00);
    __l._M_len = local_268;
    __l._M_array = local_270;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_260,__l,this_00);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&out.EmailRegex.progsize + 2));
    local_9c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270;
    do {
      local_9c8 = local_9c8 + -1;
      std::__cxx11::string::~string((string *)local_9c8);
    } while (local_9c8 != &local_350);
    std::allocator<char>::~allocator((allocator<char> *)&out.EmailRegex.field_0x22c);
    std::allocator<char>::~allocator((allocator<char> *)&out.EmailRegex.field_0x22d);
    std::allocator<char>::~allocator((allocator<char> *)&out.EmailRegex.field_0x22e);
    std::allocator<char>::~allocator((allocator<char> *)&out.EmailRegex.field_0x22f);
    LogParser::LogParser((LogParser *)&err.super_LineParser.Separator,this,"log-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_798,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "log-err> ");
    std::__cxx11::string::string((string *)&local_7b8);
    cmCTestVC::RunChild((cmCTestVC *)this,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_260,(OutputParser *)&err.super_LineParser.Separator,
                        (OutputParser *)local_798,&local_7b8,Auto);
    std::__cxx11::string::~string((string *)&local_7b8);
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_798);
    LogParser::~LogParser((LogParser *)&err.super_LineParser.Separator);
    std::__cxx11::ostringstream::ostringstream(local_930);
    std::ostream::operator<<(local_930,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBZR.cxx"
                 ,0x19f,pcVar4,false);
    std::__cxx11::string::~string(local_950);
    std::__cxx11::ostringstream::~ostringstream(local_930);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_260);
    std::__cxx11::string::~string
              ((string *)
               &bzr_log.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string(local_1e0);
  return true;
}

Assistant:

bool cmCTestBZR::LoadRevisions()
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    "
               << std::flush);

  // We are interested in every revision included in the update.
  this->Revisions.clear();
  std::string revs;
  if (atoi(this->OldRevision.c_str()) <= atoi(this->NewRevision.c_str())) {
    // DoRevision takes care of discarding the information about OldRevision
    revs = this->OldRevision + ".." + this->NewRevision;
  } else {
    return true;
  }

  // Run "bzr log" to get all global revisions of interest.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_log = { bzr,  "log",   "-v",     "-r",
                                       revs, "--xml", this->URL };
  {
    LogParser out(this, "log-out> ");
    OutputLogger err(this->Log, "log-err> ");
    this->RunChild(bzr_log, &out, &err);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);
  return true;
}